

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O2

int auth_kbdint_responses(AuthPolicy *ap,ptrlen *responses)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  iVar3 = ap->kbdint_state;
  if (iVar3 != 1) {
    iVar1 = -1;
    bVar5 = iVar3 == 0;
    iVar4 = 0;
    iVar3 = iVar1;
    if (bVar5) {
      _Var2 = ptrlen_eq_string(*responses,"stoat");
      iVar4 = 0;
      if (_Var2) {
        _Var2 = ptrlen_eq_string(responses[1],"weasel");
        if (_Var2) {
          iVar4 = ap->kbdint_state + 1;
          iVar3 = 0;
        }
      }
    }
    ap->kbdint_state = iVar4;
  }
  return iVar3;
}

Assistant:

int auth_kbdint_responses(AuthPolicy *ap, const ptrlen *responses)
{
    switch (ap->kbdint_state) {
      case 0:
        if (ptrlen_eq_string(responses[0], "stoat") &&
            ptrlen_eq_string(responses[1], "weasel")) {
            ap->kbdint_state++;
            return 0;                  /* those are the expected responses */
        } else {
            ap->kbdint_state = 0;
            return -1;
        }
        break;
      case 1:
        return +1;                     /* succeed after the zero-prompt step */
      default:
        ap->kbdint_state = 0;
        return -1;
    }
}